

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestMeasurementXMLParser.cxx
# Opt level: O0

void __thiscall
cmCTestTestMeasurementXMLParser::StartElement
          (cmCTestTestMeasurementXMLParser *this,string *name,char **attributes)

{
  int iVar1;
  char **local_28;
  char **attr;
  char **attributes_local;
  string *name_local;
  cmCTestTestMeasurementXMLParser *this_local;
  
  std::__cxx11::string::clear();
  std::__cxx11::string::operator=((string *)&this->ElementName,(string *)name);
  for (local_28 = attributes; *local_28 != (char *)0x0; local_28 = local_28 + 2) {
    iVar1 = strcmp(*local_28,"name");
    if (iVar1 == 0) {
      std::__cxx11::string::operator=((string *)&this->MeasurementName,local_28[1]);
    }
    else {
      iVar1 = strcmp(*local_28,"type");
      if (iVar1 == 0) {
        std::__cxx11::string::operator=((string *)&this->MeasurementType,local_28[1]);
      }
    }
  }
  return;
}

Assistant:

void cmCTestTestMeasurementXMLParser::StartElement(const std::string& name,
                                                   const char** attributes)
{
  this->CharacterData.clear();
  this->ElementName = name;
  for (const char** attr = attributes; *attr; attr += 2) {
    if (strcmp(attr[0], "name") == 0) {
      this->MeasurementName = attr[1];
    } else if (strcmp(attr[0], "type") == 0) {
      this->MeasurementType = attr[1];
    }
  }
}